

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

string * __thiscall
Highs::presolveStatusToString_abi_cxx11_
          (string *__return_storage_ptr__,Highs *this,HighsPresolveStatus presolve_status)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(presolve_status) {
  case kNotReduced:
    pcVar2 = "Not reduced";
    pcVar1 = "";
    break;
  case kInfeasible:
    pcVar2 = "Infeasible";
    pcVar1 = "";
    break;
  case kUnboundedOrInfeasible:
    pcVar2 = "Unbounded or infeasible";
    pcVar1 = "";
    break;
  case kReduced:
    pcVar2 = "Reduced";
    pcVar1 = "";
    break;
  case kReducedToEmpty:
    pcVar2 = "Reduced to empty";
    pcVar1 = "";
    break;
  case kTimeout:
    pcVar2 = "Timeout";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unrecognised presolve status";
    pcVar1 = "";
    break;
  case kOutOfMemory:
    pcVar2 = "Memory allocation error";
    pcVar1 = "";
    break;
  case kNotPresolved:
    pcVar2 = "Not presolved";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Highs::presolveStatusToString(
    const HighsPresolveStatus presolve_status) const {
  switch (presolve_status) {
    case HighsPresolveStatus::kNotPresolved:
      return "Not presolved";
    case HighsPresolveStatus::kNotReduced:
      return "Not reduced";
    case HighsPresolveStatus::kInfeasible:
      return "Infeasible";
    case HighsPresolveStatus::kUnboundedOrInfeasible:
      return "Unbounded or infeasible";
    case HighsPresolveStatus::kReduced:
      return "Reduced";
    case HighsPresolveStatus::kReducedToEmpty:
      return "Reduced to empty";
    case HighsPresolveStatus::kTimeout:
      return "Timeout";
    case HighsPresolveStatus::kOutOfMemory:
      return "Memory allocation error";
    default:
      assert(1 == 0);
      return "Unrecognised presolve status";
  }
}